

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
::decrement(btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
            *this)

{
  int iVar1;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
  *this_00;
  byte bVar2;
  
  this_00 = this->node_;
  if (((ulong)this_00 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>> *, unsigned int, unsigned char, google::protobuf::Edition, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>> *, unsigned int, unsigned char, google::protobuf::Edition, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                 );
  }
  if (this_00[0xb] !=
      (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
       )0x0) {
    iVar1 = this->position_;
    this->position_ = iVar1 + -1;
    bVar2 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::start(this_00);
    if ((int)(uint)bVar2 < iVar1) {
      return;
    }
  }
  decrement_slow(this);
  return;
}

Assistant:

void decrement() {
    assert_valid_generation(node_);
    if (node_->is_leaf() && --position_ >= node_->start()) {
      return;
    }
    decrement_slow();
  }